

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O0

QTableWidgetItem * __thiscall QTableModel::item(QTableModel *this,QModelIndex *index)

{
  bool bVar1;
  int iVar2;
  const_reference ppQVar3;
  QModelIndex *in_RSI;
  QTableModel *in_RDI;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined8 local_8;
  
  bVar1 = isValid(in_RDI,in_RSI);
  if (bVar1) {
    iVar2 = QModelIndex::row(in_RSI);
    QModelIndex::column(in_RSI);
    tableIndex((QTableModel *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffcc,
               in_stack_ffffffffffffffc8);
    ppQVar3 = QList<QTableWidgetItem_*>::at
                        ((QList<QTableWidgetItem_*> *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),
                         CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    local_8 = *ppQVar3;
  }
  else {
    local_8 = (QTableWidgetItem *)0x0;
  }
  return local_8;
}

Assistant:

QTableWidgetItem *QTableModel::item(const QModelIndex &index) const
{
    if (!isValid(index))
        return nullptr;
    return tableItems.at(tableIndex(index.row(), index.column()));
}